

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O2

ulong smf::MidiFile::readLittleEndian4Bytes(istream *input)

{
  ulong uVar1;
  ostream *poVar2;
  uchar buffer [4];
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  std::istream::read((char *)input,(long)buffer);
  if (((byte)input[*(long *)(*(long *)input + -0x18) + 0x20] & 2) == 0) {
    uVar1 = (ulong)(int)((uint)buffer >> 0x18 | ((uint)buffer & 0xff0000) >> 8 |
                         ((uint)buffer & 0xff00) << 8 | (int)buffer << 0x18);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: unexpected end of file.");
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

ulong MidiFile::readLittleEndian4Bytes(std::istream& input) {
	uchar buffer[4] = {0};
	input.read((char*)buffer, 4);
	if (input.eof()) {
		std::cerr << "Error: unexpected end of file." << std::endl;
		return 0;
	}
	return buffer[3] | (buffer[2] << 8) | (buffer[1] << 16) | (buffer[0] << 24);
}